

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

TokenType __thiscall wabt::WastParser::Peek(WastParser *this,size_t n)

{
  Location loc;
  bool bVar1;
  bool bVar2;
  TokenType TVar3;
  char *pcVar4;
  size_type sVar5;
  reference this_00;
  Token local_150;
  int local_10c;
  undefined1 auStack_108 [4];
  int indent;
  size_t local_f8;
  size_t local_f0;
  char *local_e8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_e0;
  Token local_d8;
  string local_98;
  size_t local_78;
  size_t local_70;
  char *local_68;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_60;
  undefined1 auStack_58 [8];
  Token cur;
  size_t n_local;
  WastParser *this_local;
  
  cur.field_2.literal_.text._M_str = (char *)n;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          pcVar4 = (char *)CircularArray<wabt::Token,_2UL>::size(&this->tokens_);
          if (cur.field_2.literal_.text._M_str < pcVar4) {
            this_00 = CircularArray<wabt::Token,_2UL>::at
                                (&this->tokens_,(size_type)cur.field_2.literal_.text._M_str);
            TVar3 = Token::token_type(this_00);
            return TVar3;
          }
          WastLexer::GetToken((Token *)auStack_58,this->lexer_);
          TVar3 = Token::token_type((Token *)auStack_58);
          if (TVar3 == LparAnn) break;
          CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,(value_type *)auStack_58);
        }
        bVar1 = Features::annotations_enabled((Features *)this->options_);
        if (bVar1) break;
        local_78 = (size_t)auStack_58;
        local_70 = cur.loc.filename._M_len;
        local_68 = cur.loc.filename._M_str;
        local_60.offset = (size_t)cur.loc.field_1.field_1.offset;
        Token::to_string_abi_cxx11_(&local_98,(Token *)auStack_58);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        Error(this,0x35ce0f,pcVar4);
        std::__cxx11::string::~string((string *)&local_98);
        local_f8 = (size_t)auStack_58;
        local_f0 = cur.loc.filename._M_len;
        local_e8 = cur.loc.filename._M_str;
        local_e0.offset = (size_t)cur.loc.field_1.field_1.offset;
        loc.filename._M_str = (char *)cur.loc.filename._M_len;
        loc.filename._M_len = (size_t)auStack_58;
        loc.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             cur.loc.filename._M_str;
        loc.field_1._8_8_ = cur.loc.field_1.field_1.offset;
        Token::Token(&local_d8,loc,First);
        CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_d8);
      }
      bVar2 = Features::code_metadata_enabled((Features *)this->options_);
      bVar1 = false;
      if (bVar2) {
        _auStack_108 = Token::text((Token *)auStack_58);
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)auStack_108,
                           "metadata.code.",0);
        bVar1 = sVar5 == 0;
      }
      if (!bVar1) break;
      CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,(value_type *)auStack_58);
    }
    local_10c = 1;
    while (0 < local_10c) {
      WastLexer::GetToken(&local_150,this->lexer_);
      cur.field_2.type_ = local_150.field_2._8_8_;
      cur.field_2.text_._M_str = local_150.field_2.literal_.text._M_str;
      cur.loc.field_1._8_8_ = local_150._32_8_;
      cur._32_8_ = local_150.field_2.text_._M_len;
      cur.loc.filename._M_str = (char *)local_150.loc.field_1.field_1.offset;
      cur.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           local_150.loc.field_1._8_8_;
      auStack_58 = (undefined1  [8])local_150.loc.filename._M_len;
      cur.loc.filename._M_len = (size_t)local_150.loc.filename._M_str;
      TVar3 = Token::token_type((Token *)auStack_58);
      if (TVar3 == Lpar) {
LAB_00279af9:
        local_10c = local_10c + 1;
      }
      else if (TVar3 == Rpar) {
        local_10c = local_10c + -1;
      }
      else if (TVar3 == LparAnn) goto LAB_00279af9;
    }
  } while( true );
}

Assistant:

TokenType WastParser::Peek(size_t n) {
  while (tokens_.size() <= n) {
    Token cur = lexer_->GetToken();
    if (cur.token_type() != TokenType::LparAnn) {
      tokens_.push_back(cur);
    } else {
      // Custom annotation. For now, discard until matching Rpar, unless it is
      // a code metadata annotation. In that case, we know how to parse it.
      if (!options_->features.annotations_enabled()) {
        Error(cur.loc, "annotations not enabled: %s", cur.to_string().c_str());
        tokens_.push_back(Token(cur.loc, TokenType::Invalid));
        continue;
      }
      if (options_->features.code_metadata_enabled() &&
          cur.text().find("metadata.code.") == 0) {
        tokens_.push_back(cur);
        continue;
      }
      int indent = 1;
      while (indent > 0) {
        cur = lexer_->GetToken();
        switch (cur.token_type()) {
          case TokenType::Lpar:
          case TokenType::LparAnn:
            indent++;
            break;

          case TokenType::Rpar:
            indent--;
            break;

          default:
            break;
        }
      }
    }
  }
  return tokens_.at(n).token_type();
}